

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.h
# Opt level: O0

void __thiscall
argParserAdvancedConfiguration::argument::argument
          (argument *this,string *argS,string *argL,string *helpMessage,
          function<int_(int,_char_**)> *callBack_)

{
  allocator local_31;
  function<int_(int,_char_**)> *local_30;
  function<int_(int,_char_**)> *callBack__local;
  string *helpMessage_local;
  string *argL_local;
  string *argS_local;
  argument *this_local;
  
  local_30 = callBack_;
  callBack__local = (function<int_(int,_char_**)> *)helpMessage;
  helpMessage_local = argL;
  argL_local = argS;
  argS_local = &this->argShort;
  std::__cxx11::string::string((string *)this,(string *)argS);
  std::__cxx11::string::string((string *)&this->argLong,(string *)argL);
  std::__cxx11::string::string((string *)&this->helpMessage,(string *)helpMessage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->additionalHelp,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string((string *)&this->enums);
  std::function<int_(int,_char_**)>::function(&this->callBack,callBack_);
  std::function<void_()>::function(&this->simpleCallBack,(nullptr_t)0x0);
  this->requiredAndNotHitJet = false;
  this->numberOfArguments = -1;
  return;
}

Assistant:

argument(string argS, string argL, string helpMessage, function<int(int, char **)> callBack_) : argLong(
                std::move(argL)), argShort(std::move(argS)), callBack(callBack_), helpMessage(
                std::move(helpMessage)) {}